

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveFile::writeTempData(CDirectiveFile *this,TempData *tempData)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *peVar2;
  path *this_00;
  undefined4 extraout_var_01;
  long *in_R8;
  long *in_R9;
  undefined1 local_140 [8];
  string local_138;
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  string local_d0;
  string local_b0;
  undefined1 local_90 [24];
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string str;
  TempData *tempData_local;
  CDirectiveFile *this_local;
  
  str.field_2._8_8_ = tempData;
  std::__cxx11::string::string((string *)local_38);
  switch(*(undefined4 *)&(this->super_CAssemblerCommand).field_0x14) {
  case 0:
    break;
  case 1:
    peVar2 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
    iVar1 = (*(peVar2->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_
              ((string *)(local_90 + 0x18),(path *)CONCAT44(extraout_var,iVar1));
    peVar2 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
    local_90._0_8_ = GenericAssemblerFile::getOriginalHeaderSize(peVar2);
    tinyformat::format<std::__cxx11::string,long>
              (&local_58,(tinyformat *)".open \"%s\",0x%08X",local_90 + 0x18,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,in_R8);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)(local_90 + 0x18));
    break;
  case 2:
    peVar2 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
    iVar1 = (*(peVar2->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_
              ((string *)(local_d8 + 8),(path *)CONCAT44(extraout_var_00,iVar1));
    peVar2 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
    local_d8 = (undefined1  [8])GenericAssemblerFile::getOriginalHeaderSize(peVar2);
    tinyformat::format<std::__cxx11::string,long>
              (&local_b0,(tinyformat *)".create \"%s\",0x%08X",local_d8 + 8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,in_R8);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)(local_d8 + 8));
    break;
  case 3:
    peVar2 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
    this_00 = GenericAssemblerFile::getOriginalFileName(peVar2);
    ghc::filesystem::path::u8string_abi_cxx11_(&local_118,this_00);
    peVar2 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
    iVar1 = (*(peVar2->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_
              ((string *)(local_140 + 8),(path *)CONCAT44(extraout_var_01,iVar1));
    peVar2 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
    local_140 = (undefined1  [8])GenericAssemblerFile::getOriginalHeaderSize(peVar2);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,long>
              (&local_f8,(tinyformat *)".open \"%s\",\"%s\",0x%08X",(char *)&local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_140 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,in_R9)
    ;
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    std::__cxx11::string::~string((string *)&local_118);
    break;
  case 4:
    std::__cxx11::string::operator=((string *)local_38,".close");
  }
  TempData::writeLine((TempData *)str.field_2._8_8_,this->virtualAddress,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void CDirectiveFile::writeTempData(TempData& tempData) const
{
	std::string str;

	switch (type)
	{
	case Type::Open:
		str = tfm::format(".open \"%s\",0x%08X",file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Create:
		str = tfm::format(".create \"%s\",0x%08X",file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Copy:
		str = tfm::format(".open \"%s\",\"%s\",0x%08X",file->getOriginalFileName().u8string(),
			file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Close:
		str = ".close";
		break;
	case Type::Invalid:
		// TODO: Assert?
		break;
	}

	tempData.writeLine(virtualAddress,str);
}